

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_el_hahn.cpp
# Opt level: O2

void __thiscall
PP_el_hahn::multiChromeDiffusion
          (PP_el_hahn *this,double mx0,double my0,double mz0,int N,bool rotFrame)

{
  C_matrix<double> *this_00;
  C_matrix<double> *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  C_matrix<double> local_538;
  double *local_510;
  double local_508;
  double dStack_500;
  double local_4f0;
  undefined1 local_4e8 [16];
  double local_4d0;
  int local_4c8;
  int local_4c4;
  ulong local_4c0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  C_matrix<double> MUsecondFID1;
  C_matrix<double> MUsecondPulse1;
  C_matrix<double> MUfirstFID1;
  C_matrix<double> MUfisrtPulse1;
  C_matrix<double> MUsteady1;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  C_matrix<double> local_288;
  C_matrix<double> local_260;
  C_matrix<double> local_238;
  C_matrix<double> local_210;
  C_matrix<double> local_1e8;
  C_matrix<double> local_1c0;
  C_matrix<double> local_198;
  C_matrix<double> local_170;
  C_matrix<double> local_148;
  C_matrix<double> local_120;
  C_matrix<double> local_f8;
  C_matrix<double> local_d0;
  C_matrix<double> local_a8;
  C_matrix<double> local_80;
  C_matrix<double> local_58;
  
  local_4e8._8_8_ = local_4e8._0_8_;
  MUsteady1._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d68;
  MUsteady1.m_L = 0;
  MUsteady1.m_C = 0;
  MUsteady1.m_A = (double *)0x0;
  MUsteady1.endL = -1;
  MUsteady1.endC = -1;
  MUfisrtPulse1._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d68;
  MUfisrtPulse1.m_L = 0;
  MUfisrtPulse1.m_C = 0;
  MUfisrtPulse1.m_A = (double *)0x0;
  MUfisrtPulse1.endL = -1;
  MUfisrtPulse1.endC = -1;
  MUfirstFID1._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d68;
  MUfirstFID1.m_L = 0;
  MUfirstFID1.m_C = 0;
  MUfirstFID1.m_A = (double *)0x0;
  MUfirstFID1.endL = -1;
  MUfirstFID1.endC = -1;
  MUsecondPulse1._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d68;
  MUsecondPulse1.m_L = 0;
  MUsecondPulse1.m_C = 0;
  MUsecondPulse1.m_A = (double *)0x0;
  MUsecondPulse1.endL = -1;
  MUsecondPulse1.endC = -1;
  MUsecondFID1._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d68;
  MUsecondFID1.m_L = 0;
  MUsecondFID1.m_C = 0;
  MUsecondFID1.m_A = (double *)0x0;
  MUsecondFID1.endL = -1;
  MUsecondFID1.endC = -1;
  local_508 = (this->super_PP_sigRMN).Bz0;
  dStack_500 = (this->super_PP_sigRMN).Bxy;
  local_4d0 = (this->super_PP_sigRMN).muz0;
  local_4b0 = (this->super_PP_sigRMN).T1;
  dVar11 = (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).muz0 = (0.0 / (local_508 * dVar11) + 1.0) * local_4d0;
  (this->super_PP_sigRMN).Bz0 = 0.0 / dVar11 + local_508;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  dVar11 = (this->super_PP_sigRMN).T2;
  if (local_4b0 <= dVar11) {
    local_4b0 = dVar11;
  }
  (this->super_PP_sigRMN).sigLength = 200;
  local_4b0 = local_4b0 / 200.0;
  local_4a8 = mx0;
  local_4a0 = my0;
  local_498 = mz0;
  dVar3 = PP_sigRMN::generateFIDsignalWithDiffusion
                    (&this->super_PP_sigRMN,mx0,my0,mz0,local_4b0,0.0);
  this_00 = &(this->super_PP_sigRMN).MU;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar11 = *pdVar4;
  local_510 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  local_510 = (double *)*local_510;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  local_4e8._0_8_ = *pdVar4;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar3 + 0.0);
  }
  C_matrix<double>::operator=(&local_120,&MUsteady1,this_00);
  C_matrix<double>::~C_matrix(&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"initSigTime.txt",(allocator<char> *)&local_538);
  this_01 = &(this->super_PP_sigRMN).T;
  C_matrix<double>::save(this_01,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  dVar1 = (this->super_PP_sigRMN).gamma;
  dVar8 = 0.0 / dVar1 + local_508;
  (this->super_PP_sigRMN).Bz0 = dVar8;
  (this->super_PP_sigRMN).Bxy = dStack_500;
  (this->super_PP_sigRMN).omega = dVar8 * dVar1;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar1 = PP_sigRMN::generateRMNsignal
                    (&this->super_PP_sigRMN,dVar11,(double)local_510,(double)local_4e8._0_8_,
                     (this->super_PP_sigRMN).tw / 4000.0,0.0);
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  local_4e8._0_8_ = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar11 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar1 = dVar3 + 0.0 + dVar1;
  dVar3 = *pdVar4;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar1);
  }
  C_matrix<double>::operator=(&local_148,&MUfisrtPulse1,this_00);
  C_matrix<double>::~C_matrix(&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"p90Time.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(this_01,&local_2c8);
  pdVar4 = &(this->super_PP_sigRMN).Bxy;
  std::__cxx11::string::~string((string *)&local_2c8);
  (this->super_PP_sigRMN).Bz0 = 0.0 / (this->super_PP_sigRMN).gamma + local_508;
  *pdVar4 = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  local_510 = pdVar4;
  dVar8 = PP_sigRMN::generateFIDsignalWithDiffusion
                    (&this->super_PP_sigRMN,(double)local_4e8._0_8_,dVar11,dVar3,
                     ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) / 4000.0,0.0);
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar11 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar3 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar1 = dVar1 + dVar8;
  dVar8 = *pdVar4;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar1);
  }
  C_matrix<double>::operator=(&local_170,&MUfirstFID1,this_00);
  C_matrix<double>::~C_matrix(&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"fidTime.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(this_01,&local_2e8);
  local_4e8._8_4_ = SUB84(dStack_500,0);
  local_4e8._0_8_ = dStack_500;
  local_4e8._12_4_ = (int)((ulong)dStack_500 >> 0x20);
  std::__cxx11::string::~string((string *)&local_2e8);
  dVar2 = (this->super_PP_sigRMN).gamma;
  dVar9 = 0.0 / dVar2 + local_508;
  (this->super_PP_sigRMN).Bz0 = dVar9;
  (this->super_PP_sigRMN).Bxy = (double)local_4e8._0_8_;
  (this->super_PP_sigRMN).omega = dVar9 * dVar2;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar8 = PP_sigRMN::generateRMNsignal
                    (&this->super_PP_sigRMN,dVar11,dVar3,dVar8,(this->super_PP_sigRMN).tw / 4000.0,
                     0.0);
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar11 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar3 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar1 = dVar1 + dVar8;
  dVar8 = *pdVar4;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar1);
  }
  C_matrix<double>::operator=(&local_198,&MUsecondPulse1,this_00);
  C_matrix<double>::~C_matrix(&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"p180Time.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(this_01,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  (this->super_PP_sigRMN).Bz0 = 0.0 / (this->super_PP_sigRMN).gamma + local_508;
  *local_510 = 0.0;
  local_510[1] = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar11 = PP_sigRMN::generateFIDsignalWithDiffusion
                     (&this->super_PP_sigRMN,dVar11,dVar3,dVar8,
                      (((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) * 1.5) / 4000.0,0.0
                     );
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar1 + dVar11);
  }
  C_matrix<double>::operator=(&local_1c0,&MUsecondFID1,this_00);
  C_matrix<double>::~C_matrix(&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"spinEchoTime.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(this_01,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  (this->super_PP_sigRMN).Bz0 = local_508;
  (this->super_PP_sigRMN).Bxy = dStack_500;
  dVar11 = (this->super_PP_sigRMN).gamma;
  uVar6 = SUB84(dVar11,0);
  uVar7 = (undefined4)((ulong)dVar11 >> 0x20);
  (this->super_PP_sigRMN).omega = local_508 * dVar11;
  local_4b8 = (double)(N + -1);
  iVar5 = 0;
  local_4c8 = 0;
  if (0 < N) {
    local_4c8 = N;
  }
  (this->super_PP_sigRMN).muz0 = local_4d0;
  local_4c0 = (ulong)(uint)N;
  while (local_4c8 != iVar5) {
    dVar11 = (this->super_PP_sigRMN).DW;
    dVar11 = ((double)iVar5 * (dVar11 + dVar11)) / local_4b8 - dVar11;
    (this->super_PP_sigRMN).muz0 =
         (dVar11 / (local_508 * (double)CONCAT44(uVar7,uVar6)) + 1.0) * local_4d0;
    (this->super_PP_sigRMN).Bz0 = dVar11 / (double)CONCAT44(uVar7,uVar6) + local_508;
    *local_510 = 0.0;
    local_510[1] = 0.0;
    (this->super_PP_sigRMN).sigLength = 200;
    local_4c4 = iVar5;
    dVar2 = PP_sigRMN::generateFIDsignalWithDiffusion
                      (&this->super_PP_sigRMN,local_4a8,local_4a0,local_498,local_4b0,dVar11);
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
    dVar3 = *pdVar4;
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
    dVar1 = *pdVar4;
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
    dVar8 = *pdVar4;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar2 + 0.0);
    }
    C_matrix<double>::operator+(&local_538,this_00,&MUsteady1);
    C_matrix<double>::operator=(&local_58,&MUsteady1,&local_538);
    C_matrix<double>::~C_matrix(&local_58);
    C_matrix<double>::~C_matrix(&local_538);
    dVar9 = (this->super_PP_sigRMN).gamma;
    dVar10 = dVar11 / dVar9 + local_508;
    (this->super_PP_sigRMN).Bz0 = dVar10;
    (this->super_PP_sigRMN).Bxy = (double)local_4e8._0_8_;
    (this->super_PP_sigRMN).omega = dVar10 * dVar9;
    (this->super_PP_sigRMN).sigLength = 4000;
    dVar9 = PP_sigRMN::generateRMNsignal
                      (&this->super_PP_sigRMN,dVar3,dVar1,dVar8,(this->super_PP_sigRMN).tw / 4000.0,
                       dVar11);
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
    dVar3 = *pdVar4;
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
    dVar1 = *pdVar4;
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
    dVar9 = dVar2 + 0.0 + dVar9;
    dVar8 = *pdVar4;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar9);
    }
    C_matrix<double>::operator+(&local_538,this_00,&MUfisrtPulse1);
    C_matrix<double>::operator=(&local_80,&MUfisrtPulse1,&local_538);
    C_matrix<double>::~C_matrix(&local_80);
    C_matrix<double>::~C_matrix(&local_538);
    (this->super_PP_sigRMN).Bz0 = dVar11 / (this->super_PP_sigRMN).gamma + local_508;
    *local_510 = 0.0;
    local_510[1] = 0.0;
    (this->super_PP_sigRMN).sigLength = 4000;
    dVar8 = PP_sigRMN::generateFIDsignalWithDiffusion
                      (&this->super_PP_sigRMN,dVar3,dVar1,dVar8,
                       ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) / 4000.0,
                       dVar11);
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
    dVar3 = *pdVar4;
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
    dVar1 = *pdVar4;
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
    dVar9 = dVar9 + dVar8;
    dVar8 = *pdVar4;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar9);
    }
    C_matrix<double>::operator+(&local_538,this_00,&MUfirstFID1);
    C_matrix<double>::operator=(&local_a8,&MUfirstFID1,&local_538);
    C_matrix<double>::~C_matrix(&local_a8);
    C_matrix<double>::~C_matrix(&local_538);
    dVar2 = (this->super_PP_sigRMN).gamma;
    dVar10 = dVar11 / dVar2 + local_508;
    (this->super_PP_sigRMN).Bz0 = dVar10;
    (this->super_PP_sigRMN).Bxy = (double)local_4e8._0_8_;
    (this->super_PP_sigRMN).omega = dVar10 * dVar2;
    (this->super_PP_sigRMN).sigLength = 4000;
    dVar8 = PP_sigRMN::generateRMNsignal
                      (&this->super_PP_sigRMN,dVar3,dVar1,dVar8,(this->super_PP_sigRMN).tw / 4000.0,
                       dVar11);
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
    dVar3 = *pdVar4;
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
    dVar1 = *pdVar4;
    pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
    dVar9 = dVar9 + dVar8;
    dVar8 = *pdVar4;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar9);
    }
    C_matrix<double>::operator+(&local_538,this_00,&MUsecondPulse1);
    C_matrix<double>::operator=(&local_d0,&MUsecondPulse1,&local_538);
    C_matrix<double>::~C_matrix(&local_d0);
    C_matrix<double>::~C_matrix(&local_538);
    (this->super_PP_sigRMN).Bz0 = dVar11 / (this->super_PP_sigRMN).gamma + local_508;
    *local_510 = 0.0;
    local_510[1] = 0.0;
    (this->super_PP_sigRMN).sigLength = 4000;
    dVar11 = PP_sigRMN::generateFIDsignalWithDiffusion
                       (&this->super_PP_sigRMN,dVar3,dVar1,dVar8,
                        (((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) * 1.5) / 4000.0,
                        dVar11);
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar9 + dVar11);
    }
    C_matrix<double>::operator+(&local_538,this_00,&MUsecondFID1);
    C_matrix<double>::operator=(&local_f8,&MUsecondFID1,&local_538);
    C_matrix<double>::~C_matrix(&local_f8);
    C_matrix<double>::~C_matrix(&local_538);
    (this->super_PP_sigRMN).Bz0 = local_508;
    (this->super_PP_sigRMN).Bxy = dStack_500;
    dVar11 = (this->super_PP_sigRMN).gamma;
    uVar6 = SUB84(dVar11,0);
    uVar7 = (undefined4)((ulong)dVar11 >> 0x20);
    (this->super_PP_sigRMN).omega = local_508 * dVar11;
    (this->super_PP_sigRMN).muz0 = local_4d0;
    iVar5 = local_4c4 + 1;
  }
  dVar11 = 1.0 / (double)((int)local_4c0 + 1);
  local_4f0 = dVar11;
  C_matrix<double>::operator*(&local_538,&MUsteady1,&local_4f0);
  C_matrix<double>::operator=(&local_1e8,&MUsteady1,&local_538);
  C_matrix<double>::~C_matrix(&local_1e8);
  C_matrix<double>::~C_matrix(&local_538);
  local_4f0 = dVar11;
  C_matrix<double>::operator*(&local_538,&MUfisrtPulse1,&local_4f0);
  C_matrix<double>::operator=(&local_210,&MUfisrtPulse1,&local_538);
  C_matrix<double>::~C_matrix(&local_210);
  C_matrix<double>::~C_matrix(&local_538);
  local_4f0 = dVar11;
  C_matrix<double>::operator*(&local_538,&MUfirstFID1,&local_4f0);
  C_matrix<double>::operator=(&local_238,&MUfirstFID1,&local_538);
  C_matrix<double>::~C_matrix(&local_238);
  C_matrix<double>::~C_matrix(&local_538);
  local_4f0 = dVar11;
  C_matrix<double>::operator*(&local_538,&MUsecondPulse1,&local_4f0);
  C_matrix<double>::operator=(&local_260,&MUsecondPulse1,&local_538);
  C_matrix<double>::~C_matrix(&local_260);
  C_matrix<double>::~C_matrix(&local_538);
  local_4f0 = dVar11;
  C_matrix<double>::operator*(&local_538,&MUsecondFID1,&local_4f0);
  C_matrix<double>::operator=(&local_288,&MUsecondFID1,&local_538);
  C_matrix<double>::~C_matrix(&local_288);
  C_matrix<double>::~C_matrix(&local_538);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"initSig.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(&MUsteady1,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"p90.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(&MUfisrtPulse1,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"fid.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(&MUfirstFID1,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"p180.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(&MUsecondPulse1,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"spinEcho.txt",(allocator<char> *)&local_538);
  C_matrix<double>::save(&MUsecondFID1,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  C_matrix<double>::~C_matrix(&MUsecondFID1);
  C_matrix<double>::~C_matrix(&MUsecondPulse1);
  C_matrix<double>::~C_matrix(&MUfirstFID1);
  C_matrix<double>::~C_matrix(&MUfisrtPulse1);
  C_matrix<double>::~C_matrix(&MUsteady1);
  return;
}

Assistant:

void PP_el_hahn::multiChromeDiffusion(double mx0, double my0, double mz0, int N, bool rotFrame)
{
    C_matrix<double> MUsteady1;
    C_matrix<double> MUfisrtPulse1;
    C_matrix<double> MUfirstFID1;
    C_matrix<double> MUsecondPulse1;
    C_matrix<double> MUsecondFID1;
    //the perturbating magnetic field pulsation is gamma*Bz0, but the actual constant field is Bz0+(dw/gamma)
    double dt;
    double tmpBz0 = Bz0;
    double tmpBxy = Bxy;
    double tempMuz0=muz0;
    double dw=0.0;
    double tmpX=mx0, tmpY=my0, tmpZ=mz0;

    muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));
    //std::cout << 1.0+(dw/(gamma*tmpBz0)) << " " << tempMuz0 << " " << muz0 << std::endl;

    /*****************************************************************/
    /** We first consider the simulation with a slightly larger field*/
    /******************************************************/
    /** initialization */
    //apply the constant magnetic field during t0
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    double t0=MAX(T1,T2);
    sigLength=200;
    dt=t0/((double) sigLength);
    double t00=0.0;

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUsteady1=MU;

    T.save("initSigTime.txt");


    /******************************************************/
    /** first pulse */
    //play one pi/2-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUfisrtPulse1=MU;

    T.save("p90Time.txt");


    /******************************************************/
    /** free induction decay */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=(0.5*TE - tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUfirstFID1=MU;

    T.save("fidTime.txt");



    /******************************************************/
    /** second pulse */
    //play the pi-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUsecondPulse1=MU;

    T.save("p180Time.txt");


    /******************************************************/
    /** spin echo */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=1.5*(TE-tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    if(!rotFrame) frameToFix(t00);
    MUsecondFID1=MU;

    T.save("spinEchoTime.txt");

    //restore parameters
    Bz0=tmpBz0;
    Bxy=tmpBxy; omega=gamma*Bz0;
    muz0=tempMuz0;
    tmpX=mx0; tmpY=my0; tmpZ=mz0;



    for(int n=0 ; n<N ; n++)
    {
        t00=0.0;
        dw=-DW+2.0*DW*((double) n)/((double) (N-1));//
        //dw=2.0*DW*((((double) rand())/((double) RAND_MAX))-0.5);
        muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));

        /*****************************************************************/
        /** We first consider the simulation with a slightly larger field*/
        /******************************************************/
        /** initialization */
        //apply the constant magnetic field during t0
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=200;
        dt=t0/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUsteady1=(MU+MUsteady1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** first pulse */
        //play one pi/2-pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=tmpBxy; omega=gamma*Bz0;
        sigLength=4000;
        dt=tw/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUfisrtPulse1=(MU+MUfisrtPulse1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** free induction decay */
        //stop the radiofrequence pulse until the next pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=4000;
        dt=(0.5*TE - tw)/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUfirstFID1=(MU+MUfirstFID1);



        /******************************************************/
        /** second pulse */
        //play the pi-pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=tmpBxy; omega=gamma*Bz0;
        sigLength=4000;
        dt=tw/((double) sigLength);//2.0*

        //suppose that the magnetic momentum at rest is null
        t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUsecondPulse1=(MU+MUsecondPulse1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** spin echo */
        //stop the radiofrequence pulse until the next pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=4000;
        dt=1.5*(TE-tw)/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        if(!rotFrame) frameToFix(t00);
        MUsecondFID1=(MU+MUsecondFID1);

        //restore the parameters
        Bz0=tmpBz0;
        Bxy=tmpBxy; omega=gamma*Bz0;
        muz0=tempMuz0;
        tmpX=mx0; tmpY=my0; tmpZ=mz0;
    }

    MUsteady1=MUsteady1*(1.0/((double) (N+1)));
    MUfisrtPulse1=MUfisrtPulse1*(1.0/((double) (N+1)));
    MUfirstFID1=MUfirstFID1*(1.0/((double) (N+1)));
    MUsecondPulse1=MUsecondPulse1*(1.0/((double) (N+1)));
    MUsecondFID1=MUsecondFID1*(1.0/((double) (N+1)));
    MUsteady1.save("initSig.txt");
    MUfisrtPulse1.save("p90.txt");
    MUfirstFID1.save("fid.txt");
    MUsecondPulse1.save("p180.txt");
    MUsecondFID1.save("spinEcho.txt");
    return;
}